

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SubqueryColumnTypes(Parse *pParse,Table *pTab,Select *pSelect,char aff)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Expr *pExpr;
  Select *pSVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  char *zIn;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  CollSeq *pCVar9;
  long lVar10;
  Select *pSVar11;
  uint uVar12;
  long lVar13;
  Select *pSVar14;
  ulong uVar15;
  Column *pCol;
  ulong uVar16;
  long in_FS_OFFSET;
  NameContext local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (pParse->eParseMode < 2)) {
    do {
      pSVar11 = pSelect;
      pSelect = pSVar11->pPrior;
    } while (pSVar11->pPrior != (Select *)0x0);
    pEVar1 = pSVar11->pEList;
    local_78.nRef = 0;
    local_78.nNcErr = 0;
    local_78.ncFlags = 0;
    local_78.nNestedSelect = 0;
    local_78.uNC.pEList = (ExprList *)0x0;
    local_78.pNext = (NameContext *)0x0;
    local_78.pParse = (Parse *)0x0;
    local_78.pWinSelect = (Select *)0x0;
    local_78.pSrcList = pSVar11->pSrc;
    if (0 < pTab->nCol) {
      pCol = pTab->aCol;
      lVar13 = 0;
      do {
        pTab->tabFlags = pTab->tabFlags | pCol->colFlags & 0x62;
        pExpr = pEVar1->a[lVar13].pExpr;
        cVar3 = sqlite3ExprAffinity(pExpr);
        pCol->affinity = cVar3;
        uVar12 = 0;
        pSVar2 = pSVar11;
        while (cVar3 < 'A') {
          if (pSVar2->pNext == (Select *)0x0) {
            pCol->affinity = aff;
            cVar3 = aff;
            break;
          }
          uVar5 = sqlite3ExprDataType(pSVar2->pEList->a[lVar13].pExpr);
          uVar12 = uVar12 | uVar5;
          pSVar2 = pSVar2->pNext;
          cVar3 = sqlite3ExprAffinity(pSVar2->pEList->a[lVar13].pExpr);
          pCol->affinity = cVar3;
        }
        if (('A' < cVar3) &&
           (pSVar14 = pSVar2->pNext, pSVar2 != pSVar11 || pSVar14 != (Select *)0x0)) {
          if (pSVar14 != (Select *)0x0) {
            do {
              uVar5 = sqlite3ExprDataType(pSVar14->pEList->a[lVar13].pExpr);
              uVar12 = uVar12 | uVar5;
              pSVar14 = pSVar14->pNext;
            } while (pSVar14 != (Select *)0x0);
            cVar3 = pCol->affinity;
          }
          cVar4 = 'A';
          if ((((cVar3 == 'B') && ((uVar12 & 1) != 0)) || (('B' < cVar3 && ((uVar12 & 2) != 0)))) ||
             (('B' < cVar3 && (cVar4 = 'F', pExpr->op == '$')))) {
            pCol->affinity = cVar4;
          }
        }
        zIn = columnTypeImpl(&local_78,pExpr,(char **)0x0,(char **)0x0,(char **)0x0);
        if ((zIn == (char *)0x0) ||
           (cVar3 = pCol->affinity, cVar4 = sqlite3AffinityType(zIn,(Column *)0x0), cVar3 != cVar4))
        {
          cVar3 = pCol->affinity;
          zIn = "NUM";
          if ((cVar3 == 'C') || (zIn = "NUM", cVar3 == 'F')) goto LAB_00186327;
          lVar10 = 1;
          do {
            if ("CADDEB"[lVar10] == cVar3) {
              zIn = sqlite3StdType[lVar10];
              if (zIn != (char *)0x0) goto LAB_00186327;
              break;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 6);
        }
        else {
LAB_00186327:
          sVar6 = strlen(zIn);
          pcVar8 = pCol->zCnName;
          if (pcVar8 == (char *)0x0) {
            uVar15 = 0;
          }
          else {
            sVar7 = strlen(pcVar8);
            uVar15 = (ulong)((uint)sVar7 & 0x3fffffff);
          }
          uVar16 = (ulong)((uint)sVar6 & 0x3fffffff);
          pcVar8 = (char *)sqlite3DbReallocOrFree(db,pcVar8,uVar16 + uVar15 + 2);
          pCol->zCnName = pcVar8;
          pCol->colFlags = pCol->colFlags & 0xfdfb;
          if (pcVar8 != (char *)0x0) {
            memcpy(pcVar8 + uVar15 + 1,zIn,uVar16 + 1);
            *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
          }
        }
        pCVar9 = sqlite3ExprCollSeq(pParse,pExpr);
        if (pCVar9 != (CollSeq *)0x0) {
          sqlite3ColumnSetColl(db,pCol,pCVar9->zName);
        }
        lVar13 = lVar13 + 1;
        pCol = pCol + 1;
      } while (lVar13 < pTab->nCol);
    }
    pTab->szTabRow = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SubqueryColumnTypes(
  Parse *pParse,      /* Parsing contexts */
  Table *pTab,        /* Add column type information to this table */
  Select *pSelect,    /* SELECT used to determine types and collations */
  char aff            /* Default affinity. */
){
  sqlite3 *db = pParse->db;
  Column *pCol;
  CollSeq *pColl;
  int i,j;
  Expr *p;
  struct ExprList_item *a;
  NameContext sNC;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || pParse->nErr>0 );
  assert( aff==SQLITE_AFF_NONE || aff==SQLITE_AFF_BLOB );
  if( db->mallocFailed || IN_RENAME_OBJECT ) return;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  a = pSelect->pEList->a;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    i64 n;
    int m = 0;
    Select *pS2 = pSelect;
    pTab->tabFlags |= (pCol->colFlags & COLFLAG_NOINSERT);
    p = a[i].pExpr;
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    while( pCol->affinity<=SQLITE_AFF_NONE && pS2->pNext!=0 ){
      m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      pS2 = pS2->pNext;
      pCol->affinity = sqlite3ExprAffinity(pS2->pEList->a[i].pExpr);
    }
    if( pCol->affinity<=SQLITE_AFF_NONE ){
      pCol->affinity = aff;
    }
    if( pCol->affinity>=SQLITE_AFF_TEXT && (pS2->pNext || pS2!=pSelect) ){
      for(pS2=pS2->pNext; pS2; pS2=pS2->pNext){
        m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      }
      if( pCol->affinity==SQLITE_AFF_TEXT && (m&0x01)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }else
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && (m&0x02)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && p->op==TK_CAST ){
        pCol->affinity = SQLITE_AFF_FLEXNUM;
      }
    }
    zType = columnType(&sNC, p, 0, 0, 0);
    if( zType==0 || pCol->affinity!=sqlite3AffinityType(zType, 0) ){
      if( pCol->affinity==SQLITE_AFF_NUMERIC
       || pCol->affinity==SQLITE_AFF_FLEXNUM
      ){
        zType = "NUM";
      }else{
        zType = 0;
        for(j=1; j<SQLITE_N_STDTYPE; j++){
          if( sqlite3StdTypeAffinity[j]==pCol->affinity ){
            zType = sqlite3StdType[j];
            break;
          }
        }
      }
    }
    if( zType ){
      const i64 k = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zCnName);
      pCol->zCnName = sqlite3DbReallocOrFree(db, pCol->zCnName, n+k+2);
      pCol->colFlags &= ~(COLFLAG_HASTYPE|COLFLAG_HASCOLL);
      if( pCol->zCnName ){
        memcpy(&pCol->zCnName[n+1], zType, k+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl ){
      assert( pTab->pIndex==0 );
      sqlite3ColumnSetColl(db, pCol, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}